

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

void Gia_ManReprToAigRepr2(Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode2;
  int v;
  
  if (pAig->pReprs != (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x1cf,"void Gia_ManReprToAigRepr2(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->pReprs != (Gia_Rpr_t *)0x0) {
    Aig_ManReprStart(pAig,pAig->vObjs->nSize);
    v = 0;
    while( true ) {
      if (pGia->nObjs <= v) {
        return;
      }
      pGVar2 = Gia_ManObj(pGia,v);
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar3 = Gia_ObjReprObj(pGia,v);
      if (pGVar3 != (Gia_Obj_t *)0x0) {
        iVar1 = Abc_Lit2Var(pGVar3->Value);
        pNode1 = Aig_ManObj(pAig,iVar1);
        iVar1 = Abc_Lit2Var(pGVar2->Value);
        pNode2 = Aig_ManObj(pAig,iVar1);
        Aig_ObjCreateRepr(pAig,pNode1,pNode2);
      }
      v = v + 1;
    }
    return;
  }
  __assert_fail("pGia->pReprs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                ,0x1d0,"void Gia_ManReprToAigRepr2(Aig_Man_t *, Gia_Man_t *)");
}

Assistant:

void Gia_ManReprToAigRepr2( Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Gia_Obj_t * pGiaObj, * pGiaRepr;
    int i;
    assert( pAig->pReprs == NULL );
    assert( pGia->pReprs != NULL );
    // set the pointers to the nodes in AIG
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Gia_ManForEachObj( pGia, pGiaObj, i )
    {
        pGiaRepr = Gia_ObjReprObj( pGia, i );
        if ( pGiaRepr == NULL )
            continue;
        Aig_ObjCreateRepr( pAig, Aig_ManObj(pAig, Abc_Lit2Var(pGiaRepr->Value)), Aig_ManObj(pAig, Abc_Lit2Var(pGiaObj->Value)) );
    }
}